

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O2

Variant * __thiscall BamTools::Variant::operator=(Variant *this,Variant *rhs)

{
  ImplBase *pIVar1;
  
  pIVar1 = rhs->data;
  if (pIVar1 != (ImplBase *)0x0) {
    pIVar1->refs = pIVar1->refs + 1;
  }
  if (this->data != (ImplBase *)0x0) {
    ImplBase::Release(this->data);
    pIVar1 = rhs->data;
  }
  this->data = pIVar1;
  return this;
}

Assistant:

Variant& operator=(const Variant& rhs)
    {
        if (rhs.data != NULL) {
            rhs.data->AddRef();
        }
        if (data != NULL) {
            data->Release();
        }
        data = rhs.data;
        return *this;
    }